

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalSerialize
          (CodeGeneratorResponse *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  string_view s;
  CodeGeneratorResponse *pCVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  uint32_t *puVar6;
  char *data;
  uint64_t value;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *this_00;
  const_reference this_01;
  UnknownFieldSet *unknown_fields;
  CodeGeneratorResponse_File *repfield;
  uint n;
  uint i;
  string_view local_48;
  string *local_38;
  string *_s;
  CodeGeneratorResponse *pCStack_28;
  uint32_t cached_has_bits;
  CodeGeneratorResponse *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  CodeGeneratorResponse *this_local;
  
  _s._4_4_ = 0;
  pCStack_28 = this;
  this_ = (CodeGeneratorResponse *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar6 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar6;
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_error_abi_cxx11_(pCStack_28);
    data = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.compiler.CodeGeneratorResponse.error");
    internal::WireFormat::VerifyUTF8StringNamedField(data,iVar3,SERIALIZE,local_48);
    pCVar1 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pCVar1,1,s,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value = _internal_supported_features(pCStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteUInt64ToArray(2,value,(uint8_t *)stream_local);
  }
  pCVar1 = this_;
  if ((_s._4_4_ & 4) != 0) {
    iVar4 = _internal_minimum_edition(pCStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                             ((EpsCopyOutputStream *)pCVar1,iVar4,(uint8_t *)stream_local);
  }
  pCVar1 = this_;
  if ((_s._4_4_ & 8) != 0) {
    iVar4 = _internal_maximum_edition(pCStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArrayWithField<4>
                             ((EpsCopyOutputStream *)pCVar1,iVar4,(uint8_t *)stream_local);
  }
  repfield._4_4_ = 0;
  uVar5 = _internal_file_size(pCStack_28);
  for (; repfield._4_4_ < uVar5; repfield._4_4_ = repfield._4_4_ + 1) {
    this_00 = _internal_file(pCStack_28);
    this_01 = RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::Get
                        (this_00,repfield._4_4_);
    iVar3 = CodeGeneratorResponse_File::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (0xf,(MessageLite *)this_01,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(pCStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pCStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL CodeGeneratorResponse::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const CodeGeneratorResponse& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorResponse)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string error = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_error();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.compiler.CodeGeneratorResponse.error");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional uint64 supported_features = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        2, this_._internal_supported_features(), target);
  }

  // optional int32 minimum_edition = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_minimum_edition(), target);
  }

  // optional int32 maximum_edition = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>(
            stream, this_._internal_maximum_edition(), target);
  }

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_file_size());
       i < n; i++) {
    const auto& repfield = this_._internal_file().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            15, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorResponse)
  return target;
}